

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O1

token __thiscall
wigwag::token::
create<wigwag::detail::listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>::handler_node,wigwag::detail::intrusive_ptr<wigwag::detail::listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>>&,std::function<void()>>
          (token *this,
          intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
          *args,function<void_()> *args_1)

{
  intrusive_ref_counter<wigwag::ref_counter::atomic,_wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  *piVar1;
  _Manager_type p_Var2;
  handler_node *this_00;
  intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  local_50;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  
  this_00 = (handler_node *)operator_new(0x50);
  local_50 = (intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
              )args->_raw;
  if (local_50._raw !=
      (listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
       *)0x0) {
    LOCK();
    ((local_50._raw)->
    super_intrusive_ref_counter<wigwag::ref_counter::atomic,_wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
    ).super_atomic._counter.super___atomic_base<int>._M_i =
         ((local_50._raw)->
         super_intrusive_ref_counter<wigwag::ref_counter::atomic,_wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
         ).super_atomic._counter.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (_Manager_type)0x0;
  local_30 = args_1->_M_invoker;
  p_Var2 = (args_1->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)&(args_1->super__Function_base)._M_functor
    ;
    local_48._8_8_ = *(undefined8 *)((long)&(args_1->super__Function_base)._M_functor + 8);
    (args_1->super__Function_base)._M_manager = (_Manager_type)0x0;
    args_1->_M_invoker = (_Invoker_type)0x0;
    local_38 = p_Var2;
  }
  detail::
  listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  ::handler_node::handler_node(this_00,&local_50,(handler_type *)&local_48);
  this->_impl = (implementation *)this_00;
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_50._raw !=
      (listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
       *)0x0) {
    LOCK();
    piVar1 = &(local_50._raw)->
              super_intrusive_ref_counter<wigwag::ref_counter::atomic,_wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
    ;
    (piVar1->super_atomic)._counter.super___atomic_base<int>._M_i =
         (piVar1->super_atomic)._counter.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((piVar1->super_atomic)._counter.super___atomic_base<int>._M_i == 0) {
      (*(local_50._raw)->_vptr_listenable_impl[1])();
    }
  }
  return (token)(implementation *)this;
}

Assistant:

static token create(Args_&&... args)
        { return token(new Implementation_(std::forward<Args_>(args)...)); }